

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfiledialog.cpp
# Opt level: O3

void __thiscall QFileDialogPrivate::deleteCurrent(QFileDialogPrivate *this)

{
  QAbstractProxyModel *pQVar1;
  QWidget *parent;
  QModelIndex *pQVar2;
  undefined1 *puVar3;
  char cVar4;
  uint uVar5;
  StandardButton SVar6;
  int iVar7;
  QWidget *parent_00;
  byte bVar8;
  long lVar9;
  long in_FS_OFFSET;
  QAnyStringView QVar10;
  QAnyStringView QVar11;
  QPersistentModelIndex index;
  QModelIndex local_e8;
  QModelIndex local_d0;
  QArrayData *local_b8;
  undefined1 *puStack_b0;
  undefined1 *local_a8;
  QArrayData *local_98;
  undefined1 *puStack_90;
  QAbstractItemModel *local_88;
  QPersistentModelIndex local_80;
  QArrayData *local_78;
  undefined1 *puStack_70;
  undefined1 *local_68;
  QArrayData *local_58;
  undefined1 *puStack_50;
  totally_ordered_wrapper<const_QAbstractItemModel_*> local_48;
  undefined8 local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  cVar4 = QFileSystemModel::isReadOnly();
  if (cVar4 == '\0') {
    local_68 = &DAT_aaaaaaaaaaaaaaaa;
    local_78 = (QArrayData *)&DAT_aaaaaaaaaaaaaaaa;
    puStack_70 = &DAT_aaaaaaaaaaaaaaaa;
    QAbstractItemView::selectionModel((QAbstractItemView *)((this->qFileDialogUi).d)->listView);
    QItemSelectionModel::selectedRows((int)&local_78);
    puVar3 = puStack_70;
    if (local_68 != (undefined1 *)0x0) {
      lVar9 = (long)local_68 * 0x18;
LAB_004e9957:
      do {
        lVar9 = lVar9 + -0x18;
        local_80.d = (QPersistentModelIndexData *)&DAT_aaaaaaaaaaaaaaaa;
        QPersistentModelIndex::QPersistentModelIndex(&local_80,(QModelIndex *)(puVar3 + lVar9));
        QAbstractItemView::rootIndex
                  ((QModelIndex *)&local_58,(QAbstractItemView *)((this->qFileDialogUi).d)->listView
                  );
        cVar4 = comparesEqual(&local_80,(QModelIndex *)&local_58);
        if (cVar4 == '\0') {
          QPersistentModelIndex::row();
          QPersistentModelIndex::sibling((int)&local_98,(int)&local_80);
          pQVar1 = this->proxyModel;
          if (pQVar1 == (QAbstractProxyModel *)0x0) {
            local_48.ptr = local_88;
            local_58 = local_98;
            puStack_50 = puStack_90;
          }
          else {
            (**(code **)(*(long *)pQVar1 + 400))((QModelIndex *)&local_58,pQVar1,&local_98);
          }
          QPersistentModelIndex::operator=(&local_80,(QModelIndex *)&local_58);
          cVar4 = QPersistentModelIndex::isValid();
          if (cVar4 != '\0') {
            local_88 = (QAbstractItemModel *)&DAT_aaaaaaaaaaaaaaaa;
            local_98 = (QArrayData *)&DAT_aaaaaaaaaaaaaaaa;
            puStack_90 = &DAT_aaaaaaaaaaaaaaaa;
            iVar7 = (int)(QModelIndex *)&local_58;
            QPersistentModelIndex::data(iVar7);
            ::QVariant::toString();
            ::QVariant::~QVariant((QVariant *)&local_58);
            local_a8 = &DAT_aaaaaaaaaaaaaaaa;
            local_b8 = (QArrayData *)&DAT_aaaaaaaaaaaaaaaa;
            puStack_b0 = &DAT_aaaaaaaaaaaaaaaa;
            QPersistentModelIndex::data(iVar7);
            ::QVariant::toString();
            ::QVariant::~QVariant((QVariant *)&local_58);
            QPersistentModelIndex::parent();
            if (local_d0.m.ptr == (QAbstractItemModel *)0x0) {
              local_58 = (QArrayData *)0x0;
              puStack_50 = (undefined1 *)0x0;
              local_48.ptr = (QAbstractItemModel *)0x0;
              local_40 = 2;
            }
            else {
              (**(code **)(*(long *)local_d0.m.ptr + 0x90))
                        ((QModelIndex *)&local_58,local_d0.m.ptr,&local_d0,0x103);
            }
            uVar5 = ::QVariant::toInt((bool *)&local_58);
            ::QVariant::~QVariant((QVariant *)&local_58);
            parent = *(QWidget **)&(this->super_QDialogPrivate).super_QWidgetPrivate.field_0x8;
            parent_00 = parent;
            if ((uVar5 >> 9 & 1) == 0) {
              QMetaObject::tr((char *)&local_58,(char *)&QFileDialog::staticMetaObject,0x6e59b4);
              QMetaObject::tr((char *)&local_e8,(char *)&QFileDialog::staticMetaObject,0x6e5c1c);
              QVar10.m_size = (size_t)&local_e8;
              QVar10.field_0.m_data = &local_d0;
              QString::arg_impl(QVar10,(int)puStack_90,(QChar)(char16_t)local_88);
              SVar6 = QMessageBox::warning
                                (parent,(QString *)&local_58,(QString *)&local_d0,
                                 (StandardButtons)0x14000,No);
              if ((QArrayData *)local_d0._0_8_ != (QArrayData *)0x0) {
                LOCK();
                (((QBasicAtomicInt *)local_d0._0_8_)->_q_value).super___atomic_base<int>._M_i =
                     (((QBasicAtomicInt *)local_d0._0_8_)->_q_value).super___atomic_base<int>._M_i +
                     -1;
                UNLOCK();
                if ((((QBasicAtomicInt *)local_d0._0_8_)->_q_value).super___atomic_base<int>._M_i ==
                    0) {
                  QArrayData::deallocate((QArrayData *)local_d0._0_8_,2,0x10);
                }
              }
              if ((QArrayData *)local_e8._0_8_ != (QArrayData *)0x0) {
                LOCK();
                (((QBasicAtomicInt *)local_e8._0_8_)->_q_value).super___atomic_base<int>._M_i =
                     (((QBasicAtomicInt *)local_e8._0_8_)->_q_value).super___atomic_base<int>._M_i +
                     -1;
                UNLOCK();
                if ((((QBasicAtomicInt *)local_e8._0_8_)->_q_value).super___atomic_base<int>._M_i ==
                    0) {
                  QArrayData::deallocate((QArrayData *)local_e8._0_8_,2,0x10);
                }
              }
              if (local_58 != (QArrayData *)0x0) {
                LOCK();
                (local_58->ref_)._q_value.super___atomic_base<int>._M_i =
                     (local_58->ref_)._q_value.super___atomic_base<int>._M_i + -1;
                UNLOCK();
                if ((local_58->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
                  QArrayData::deallocate(local_58,2,0x10);
                }
              }
              bVar8 = 1;
              if (SVar6 != No) {
                parent_00 = *(QWidget **)
                             &(this->super_QDialogPrivate).super_QWidgetPrivate.field_0x8;
                goto LAB_004e9c37;
              }
            }
            else {
LAB_004e9c37:
              QMetaObject::tr((char *)&local_58,(char *)&QFileDialog::staticMetaObject,0x6e59b4);
              QMetaObject::tr((char *)&local_e8,(char *)&QFileDialog::staticMetaObject,0x6e5c56);
              QVar11.m_size = (size_t)&local_e8;
              QVar11.field_0.m_data = &local_d0;
              QString::arg_impl(QVar11,(int)puStack_90,(QChar)(char16_t)local_88);
              SVar6 = QMessageBox::warning
                                (parent_00,(QString *)&local_58,(QString *)&local_d0,
                                 (StandardButtons)0x14000,No);
              if ((QArrayData *)local_d0._0_8_ != (QArrayData *)0x0) {
                LOCK();
                (((QBasicAtomicInt *)local_d0._0_8_)->_q_value).super___atomic_base<int>._M_i =
                     (((QBasicAtomicInt *)local_d0._0_8_)->_q_value).super___atomic_base<int>._M_i +
                     -1;
                UNLOCK();
                if ((((QBasicAtomicInt *)local_d0._0_8_)->_q_value).super___atomic_base<int>._M_i ==
                    0) {
                  QArrayData::deallocate((QArrayData *)local_d0._0_8_,2,0x10);
                }
              }
              if ((QArrayData *)local_e8._0_8_ != (QArrayData *)0x0) {
                LOCK();
                (((QBasicAtomicInt *)local_e8._0_8_)->_q_value).super___atomic_base<int>._M_i =
                     (((QBasicAtomicInt *)local_e8._0_8_)->_q_value).super___atomic_base<int>._M_i +
                     -1;
                UNLOCK();
                if ((((QBasicAtomicInt *)local_e8._0_8_)->_q_value).super___atomic_base<int>._M_i ==
                    0) {
                  QArrayData::deallocate((QArrayData *)local_e8._0_8_,2,0x10);
                }
              }
              if (local_58 != (QArrayData *)0x0) {
                LOCK();
                (local_58->ref_)._q_value.super___atomic_base<int>._M_i =
                     (local_58->ref_)._q_value.super___atomic_base<int>._M_i + -1;
                UNLOCK();
                if ((local_58->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
                  QArrayData::deallocate(local_58,2,0x10);
                }
              }
              bVar8 = 1;
              if ((SVar6 != No) && (cVar4 = QPersistentModelIndex::isValid(), cVar4 != '\0')) {
                pQVar2 = (QModelIndex *)this->model;
                QPersistentModelIndex::operator_cast_to_QModelIndex
                          ((QModelIndex *)&local_58,&local_80);
                cVar4 = QFileSystemModel::isDir(pQVar2);
                if (cVar4 == '\0') {
LAB_004e9dbc:
                  pQVar2 = (QModelIndex *)this->model;
                  QPersistentModelIndex::operator_cast_to_QModelIndex
                            ((QModelIndex *)&local_58,&local_80);
                  QFileSystemModel::remove(pQVar2);
                }
                else {
                  QPersistentModelIndex::operator_cast_to_QModelIndex(&local_d0,&local_80);
                  QFileSystemModel::fileInfo(&local_e8);
                  cVar4 = QFileInfo::isSymLink();
                  QFileInfo::~QFileInfo((QFileInfo *)&local_e8);
                  if (cVar4 != '\0') goto LAB_004e9dbc;
                  local_48.ptr = (QAbstractItemModel *)&DAT_aaaaaaaaaaaaaaaa;
                  local_58 = (QArrayData *)&DAT_aaaaaaaaaaaaaaaa;
                  puStack_50 = &DAT_aaaaaaaaaaaaaaaa;
                  bVar8 = 0;
                  QFileSystemModel::index((QString *)&local_58,(int)this->model);
                  cVar4 = QFileSystemModel::remove((QModelIndex *)this->model);
                  if (cVar4 != '\0') goto LAB_004e9ddc;
                  QWidget::windowTitle((QString *)&local_58,parent);
                  QMetaObject::tr((char *)&local_d0,(char *)&QFileDialog::staticMetaObject,0x6e5c7c)
                  ;
                  QMessageBox::warning
                            (parent,(QString *)&local_58,(QString *)&local_d0,(StandardButtons)0x400
                             ,NoButton);
                  if ((QArrayData *)local_d0._0_8_ != (QArrayData *)0x0) {
                    LOCK();
                    (((QBasicAtomicInt *)local_d0._0_8_)->_q_value).super___atomic_base<int>._M_i =
                         (((QBasicAtomicInt *)local_d0._0_8_)->_q_value).super___atomic_base<int>.
                         _M_i + -1;
                    UNLOCK();
                    if ((((QBasicAtomicInt *)local_d0._0_8_)->_q_value).super___atomic_base<int>.
                        _M_i == 0) {
                      QArrayData::deallocate((QArrayData *)local_d0._0_8_,2,0x10);
                    }
                  }
                  if (local_58 != (QArrayData *)0x0) {
                    LOCK();
                    (local_58->ref_)._q_value.super___atomic_base<int>._M_i =
                         (local_58->ref_)._q_value.super___atomic_base<int>._M_i + -1;
                    UNLOCK();
                    if ((local_58->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
                      QArrayData::deallocate(local_58,2,0x10);
                    }
                  }
                }
                bVar8 = 0;
              }
            }
LAB_004e9ddc:
            if (local_b8 != (QArrayData *)0x0) {
              LOCK();
              (local_b8->ref_)._q_value.super___atomic_base<int>._M_i =
                   (local_b8->ref_)._q_value.super___atomic_base<int>._M_i + -1;
              UNLOCK();
              if ((local_b8->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
                QArrayData::deallocate(local_b8,2,0x10);
              }
            }
            if (local_98 != (QArrayData *)0x0) {
              LOCK();
              (local_98->ref_)._q_value.super___atomic_base<int>._M_i =
                   (local_98->ref_)._q_value.super___atomic_base<int>._M_i + -1;
              UNLOCK();
              if ((local_98->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
                QArrayData::deallocate(local_98,2,0x10);
              }
            }
            QPersistentModelIndex::~QPersistentModelIndex(&local_80);
            if (!(bool)(~bVar8 & lVar9 != 0)) break;
            goto LAB_004e9957;
          }
        }
        QPersistentModelIndex::~QPersistentModelIndex(&local_80);
      } while (lVar9 != 0);
    }
    if (local_78 != (QArrayData *)0x0) {
      LOCK();
      (local_78->ref_)._q_value.super___atomic_base<int>._M_i =
           (local_78->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((local_78->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(local_78,0x18,0x10);
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QFileDialogPrivate::deleteCurrent()
{
    if (model->isReadOnly())
        return;

    const QModelIndexList list = qFileDialogUi->listView->selectionModel()->selectedRows();
    for (auto it = list.crbegin(), end = list.crend(); it != end; ++it) {
        QPersistentModelIndex index = *it;
        if (index == qFileDialogUi->listView->rootIndex())
            continue;

        index = mapToSource(index.sibling(index.row(), 0));
        if (!index.isValid())
            continue;

        QString fileName = index.data(QFileSystemModel::FileNameRole).toString();
        QString filePath = index.data(QFileSystemModel::FilePathRole).toString();

        QFile::Permissions p(index.parent().data(QFileSystemModel::FilePermissions).toInt());
#if QT_CONFIG(messagebox)
        Q_Q(QFileDialog);
        if (!(p & QFile::WriteUser) && (QMessageBox::warning(q_func(), QFileDialog::tr("Delete"),
                                    QFileDialog::tr("'%1' is write protected.\nDo you want to delete it anyway?")
                                    .arg(fileName),
                                     QMessageBox::Yes | QMessageBox::No, QMessageBox::No) == QMessageBox::No))
            return;
        else if (QMessageBox::warning(q_func(), QFileDialog::tr("Delete"),
                                      QFileDialog::tr("Are you sure you want to delete '%1'?")
                                      .arg(fileName),
                                      QMessageBox::Yes | QMessageBox::No, QMessageBox::No) == QMessageBox::No)
            return;

        // the event loop has run, we have to validate if the index is valid because the model might have removed it.
        if (!index.isValid())
            return;

#else
        if (!(p & QFile::WriteUser))
            return;
#endif // QT_CONFIG(messagebox)

        if (model->isDir(index) && !model->fileInfo(index).isSymLink()) {
            if (!removeDirectory(filePath)) {
#if QT_CONFIG(messagebox)
            QMessageBox::warning(q, q->windowTitle(),
                                QFileDialog::tr("Could not delete directory."));
#endif
            }
        } else {
            model->remove(index);
        }
    }
}